

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

void helper_mvcin(CPUS390XState_conflict *env,uint32_t l,uint64_t dest,uint64_t src)

{
  ulong uVar1;
  uint8_t byte;
  vaddr vaddr;
  int mmu_idx;
  uint size;
  int offset;
  bool bVar2;
  uintptr_t unaff_retaddr;
  S390Access local_80;
  S390Access local_58;
  
  uVar1 = (env->psw).mask;
  mmu_idx = 3;
  if ((uVar1 >> 0x3a & 1) != 0) {
    switch((uint)(uVar1 >> 0x2e) & 3) {
    case 0:
      mmu_idx = 0;
      break;
    case 1:
      abort();
    case 2:
      mmu_idx = 1;
      break;
    case 3:
      mmu_idx = 2;
    }
  }
  size = l + 1;
  vaddr = (src - size) + 1;
  if ((uVar1 >> 0x20 & 1) == 0) {
    if ((int)uVar1 < 0) {
      vaddr = (vaddr)((uint)vaddr & 0x7fffffff);
    }
    else {
      vaddr = (vaddr)((uint)vaddr & 0xffffff);
    }
  }
  offset = 0;
  access_prepare(&local_58,env,vaddr,size,MMU_DATA_LOAD,mmu_idx,unaff_retaddr);
  access_prepare(&local_80,env,dest,size,MMU_DATA_STORE,mmu_idx,unaff_retaddr);
  if (size != 0) {
    do {
      byte = access_get_byte(env,&local_58,l,unaff_retaddr);
      access_set_byte(env,&local_80,offset,byte,unaff_retaddr);
      offset = offset + 1;
      bVar2 = l != 0;
      l = l - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void HELPER(mvcin)(CPUS390XState *env, uint32_t l, uint64_t dest, uint64_t src)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    S390Access srca, desta;
    uintptr_t ra = GETPC();
    int i;

    /* MVCIN always copies one more byte than specified - maximum is 256 */
    l++;

    src = wrap_address(env, src - l + 1);
    srca = access_prepare(env, src, l, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, dest, l, MMU_DATA_STORE, mmu_idx, ra);
    for (i = 0; i < l; i++) {
        const uint8_t x = access_get_byte(env, &srca, l - i - 1, ra);

        access_set_byte(env, &desta, i, x, ra);
    }
}